

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_str_replace(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  sxu32 sVar2;
  void *pvVar3;
  sxi32 sVar4;
  int iVar5;
  char *pData;
  uint uVar6;
  SyString *pSVar7;
  ulong uVar8;
  code *pcVar9;
  ulong uVar10;
  sxu32 nOfft;
  int nByte;
  uint local_dc;
  SySet local_d8;
  jx9_context *local_b0;
  SyBlob sWorker;
  SyString sTemp;
  SySet local_78;
  str_replace_data sRep;
  
  if (nArg < 3) {
    jx9_result_null(pCtx);
  }
  else {
    local_d8.pAllocator = &pCtx->pVm->sAllocator;
    local_78.nUsed = 0;
    local_78.nSize = 0;
    local_78.eSize = 0x10;
    local_78.nCursor = 0;
    local_78.pBase = (void *)0x0;
    local_78.pUserData = (void *)0x0;
    local_d8.nUsed = 0;
    local_d8.nSize = 0;
    local_d8.eSize = 0x10;
    local_d8.nCursor = 0;
    local_d8.pBase = (void *)0x0;
    local_d8.pUserData = (void *)0x0;
    sWorker.pBlob = (void *)0x0;
    sWorker.nByte = 0;
    sWorker.mByte = 0;
    sWorker.nFlags = 0;
    sWorker.pAllocator = local_d8.pAllocator;
    local_78.pAllocator = local_d8.pAllocator;
    SyZero(&sRep,0x20);
    sRep.pCollector = &local_78;
    sRep.pCtx = pCtx;
    pData = jx9_value_to_string(apArg[2],&nByte);
    if (nByte < 1) {
      jx9_result_string(pCtx,"",0);
    }
    else {
      SyBlobAppend(&sWorker,pData,nByte);
      pjVar1 = *apArg;
      if ((pjVar1->iFlags & 0x40) == 0) {
        sTemp.zString = jx9_value_to_string(pjVar1,&nByte);
        if (nByte < 1) {
          jx9_result_value(pCtx,apArg[2]);
          return 0;
        }
        sTemp.nByte = nByte;
        SySetPut(&local_78,&sTemp);
      }
      else {
        jx9_array_walk(pjVar1,StrReplaceWalker,&sRep);
      }
      pjVar1 = apArg[1];
      local_dc = pjVar1->iFlags;
      if ((local_dc & 0x40) == 0) {
        sTemp.zString = jx9_value_to_string(pjVar1,&nByte);
        sTemp.nByte = nByte;
        SySetPut(&local_d8,&sTemp);
      }
      else {
        sRep.pCollector = &local_d8;
        jx9_array_walk(pjVar1,StrReplaceWalker,&sRep);
      }
      local_78._24_8_ = local_78._24_8_ & 0xffffffff;
      local_d8._24_8_ = local_d8._24_8_ & 0xffffffff;
      sTemp.zString = "";
      sTemp.nByte = 0;
      local_b0 = pCtx;
      sVar4 = SyStrncmp((pCtx->pFunc->sName).zString,"str_ireplace",0xc);
      pcVar9 = SyBlobSearch;
      if (sVar4 == 0) {
        pcVar9 = iPatternMatch;
      }
      uVar6 = 0;
      while( true ) {
        pvVar3 = local_78.pBase;
        if (local_78.nUsed <= uVar6) break;
        uVar8 = (ulong)(local_78.eSize * uVar6);
        local_78.nCursor = uVar6 + 1;
        uVar6 = uVar6 + 1;
        if (*(int *)((long)local_78.pBase + uVar8 + 8) != 0) {
          sVar2 = local_d8.eSize;
          if ((local_dc & 0x40) == 0) {
            if (local_d8.nUsed == 0) goto LAB_0012d290;
            uVar6 = local_d8.nUsed - 1;
LAB_0012d284:
            pSVar7 = (SyString *)((ulong)(uVar6 * sVar2) + (long)local_d8.pBase);
            if (pSVar7 == (SyString *)0x0) goto LAB_0012d290;
          }
          else {
            uVar6 = local_d8.nCursor;
            if (local_d8.nCursor < local_d8.nUsed) {
              local_d8.nCursor = local_d8.nCursor + 1;
              goto LAB_0012d284;
            }
            local_d8._24_8_ = local_d8._24_8_ & 0xffffffff;
LAB_0012d290:
            pSVar7 = &sTemp;
          }
          nOfft = 0;
          uVar10 = 0;
          while( true ) {
            uVar6 = (uint)uVar10;
            if ((sWorker.nByte < uVar6 || sWorker.nByte - uVar6 == 0) ||
               (iVar5 = (*pcVar9)(uVar10 + (long)sWorker.pBlob,sWorker.nByte - uVar6,
                                  *(undefined8 *)((long)pvVar3 + uVar8),
                                  *(undefined4 *)((long)pvVar3 + uVar8 + 8),&nOfft), iVar5 != 0))
            break;
            StringReplace(&sWorker,nOfft + uVar6,*(int *)((long)pvVar3 + uVar8 + 8),pSVar7->zString,
                          pSVar7->nByte);
            uVar10 = (ulong)(uVar6 + nOfft + pSVar7->nByte);
          }
          uVar6 = local_78.nCursor;
        }
      }
      local_78._24_8_ = local_78._24_8_ & 0xffffffff;
      jx9_result_string(local_b0,(char *)sWorker.pBlob,sWorker.nByte);
      SySetRelease(&local_78);
      SySetRelease(&local_d8);
      SyBlobRelease(&sWorker);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_str_replace(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyString sTemp, *pSearch, *pReplace;
	ProcStringMatch xMatch;
	const char *zIn, *zFunc;
	str_replace_data sRep;
	SyBlob sWorker;
	SySet sReplace;
	SySet sSearch;
	int rep_str;
	int nByte;
	sxi32 rc;
	if( nArg < 3 ){
		/* Missing/Invalid arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Initialize fields */
	SySetInit(&sSearch, &pCtx->pVm->sAllocator, sizeof(SyString));
	SySetInit(&sReplace, &pCtx->pVm->sAllocator, sizeof(SyString));
	SyBlobInit(&sWorker, &pCtx->pVm->sAllocator);
	SyZero(&sRep, sizeof(str_replace_data));
	sRep.pCtx = pCtx;
	sRep.pCollector = &sSearch;
	rep_str = 0;
	/* Extract the subject */
	zIn = jx9_value_to_string(apArg[2], &nByte);
	if( nByte < 1 ){
		/* Nothing to replace, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Copy the subject */
	SyBlobAppend(&sWorker, (const void *)zIn, (sxu32)nByte);
	/* Search string */
	if( jx9_value_is_json_array(apArg[0]) ){
		/* Collect search string */
		jx9_array_walk(apArg[0], StrReplaceWalker, &sRep);
	}else{
		/* Single pattern */
		zIn = jx9_value_to_string(apArg[0], &nByte);
		if( nByte < 1 ){
			/* Return the subject untouched since no search string is available */
			jx9_result_value(pCtx, apArg[2]/* Subject as thrird argument*/);
			return JX9_OK;
		}
		SyStringInitFromBuf(&sTemp, zIn, nByte);
		/* Save for later processing */
		SySetPut(&sSearch, (const void *)&sTemp);
	}
	/* Replace string */
	if( jx9_value_is_json_array(apArg[1]) ){
		/* Collect replace string */
		sRep.pCollector = &sReplace;
		jx9_array_walk(apArg[1], StrReplaceWalker, &sRep);
	}else{
		/* Single needle */
		zIn = jx9_value_to_string(apArg[1], &nByte);
		rep_str = 1;
		SyStringInitFromBuf(&sTemp, zIn, nByte);
		/* Save for later processing */
		SySetPut(&sReplace, (const void *)&sTemp);
	}
	/* Reset loop cursors */
	SySetResetCursor(&sSearch);
	SySetResetCursor(&sReplace);
	pReplace = pSearch = 0; /* cc warning */
	SyStringInitFromBuf(&sTemp, "", 0);
	/* Extract function name */
	zFunc = jx9_function_name(pCtx);
	/* Set the default pattern match routine */
	xMatch = SyBlobSearch;
	if( SyStrncmp(zFunc, "str_ireplace", sizeof("str_ireplace") - 1) ==  0 ){
		/* Case insensitive pattern match */
		xMatch = iPatternMatch;
	}
	/* Start the replace process */
	while( SXRET_OK == SySetGetNextEntry(&sSearch, (void **)&pSearch) ){
		sxu32 nCount, nOfft;
		if( pSearch->nByte <  1 ){
			/* Empty string, ignore */
			continue;
		}
		/* Extract the replace string */
		if( rep_str ){
			pReplace = (SyString *)SySetPeek(&sReplace);
		}else{
			if( SXRET_OK != SySetGetNextEntry(&sReplace, (void **)&pReplace) ){
				/* Sepecial case when 'replace set' has fewer values than the search set.
				 * An empty string is used for the rest of replacement values
				 */
				pReplace = 0;
			}
		}
		if( pReplace == 0 ){
			/* Use an empty string instead */
			pReplace = &sTemp;
		}
		nOfft = nCount = 0;
		for(;;){
			if( nCount >= SyBlobLength(&sWorker) ){
				break;
			}
			/* Perform a pattern lookup */
			rc = xMatch(SyBlobDataAt(&sWorker, nCount), SyBlobLength(&sWorker) - nCount, (const void *)pSearch->zString, 
				pSearch->nByte, &nOfft);
			if( rc != SXRET_OK ){
				/* Pattern not found */
				break;
			}
			/* Perform the replace operation */
			StringReplace(&sWorker, nCount+nOfft, (int)pSearch->nByte, pReplace->zString, (int)pReplace->nByte);
			/* Increment offset counter */
			nCount += nOfft + pReplace->nByte;
		}
	}
	/* All done, clean-up the mess left behind */
	jx9_result_string(pCtx, (const char *)SyBlobData(&sWorker), (int)SyBlobLength(&sWorker));
	SySetRelease(&sSearch);
	SySetRelease(&sReplace);
	SyBlobRelease(&sWorker);
	return JX9_OK;
}